

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_currentpos(FCommandLine *argv,APlayerPawn *who,int key)

{
  double dVar1;
  double dVar2;
  double dVar3;
  TAngle<double> local_30;
  AActor *local_28;
  AActor *mo;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_28 = (AActor *)(&players)[(long)consoleplayer * 0x54];
  mo._4_4_ = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  if (local_28 == (AActor *)0x0) {
    Printf("You are not in game!\n");
  }
  else {
    dVar1 = AActor::X(local_28);
    dVar2 = AActor::Y(local_28);
    dVar3 = AActor::Z(local_28);
    TAngle<double>::Normalized360(&local_30);
    Printf("Current player position: (%1.3f,%1.3f,%1.3f), angle: %1.3f, floorheight: %1.3f, sector:%d, lightlevel: %d\n"
           ,dVar1,dVar2,dVar3,local_30.Degrees,local_28->floorz,
           (ulong)(uint)local_28->Sector->sectornum,(ulong)(uint)(int)local_28->Sector->lightlevel);
  }
  return;
}

Assistant:

CCMD(currentpos)
{
	AActor *mo = players[consoleplayer].mo;
	if(mo)
	{
		Printf("Current player position: (%1.3f,%1.3f,%1.3f), angle: %1.3f, floorheight: %1.3f, sector:%d, lightlevel: %d\n",
			mo->X(), mo->Y(), mo->Z(), mo->Angles.Yaw.Normalized360().Degrees, mo->floorz, mo->Sector->sectornum, mo->Sector->lightlevel);
	}
	else
	{
		Printf("You are not in game!\n");
	}
}